

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void rec_call_setup(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  uint8_t uVar1;
  TRef *pTVar2;
  int iVar3;
  uint uVar4;
  TRef TVar5;
  TRef TVar6;
  IRRef1 IVar7;
  long lVar8;
  TValue *pTVar9;
  ulong uVar10;
  GCobj *o;
  bool bVar11;
  ptrdiff_t local_90;
  RecordIndex ix;
  
  pTVar2 = J->base;
  pTVar9 = J->L->base + func;
  if (pTVar2[func] == 0) {
    sload(J,func);
  }
  uVar10 = (ulong)(func + 1);
  lVar8 = 0;
  if (0 < nargs) {
    lVar8 = nargs;
  }
  while( true ) {
    uVar10 = uVar10 + 1;
    bVar11 = lVar8 == 0;
    lVar8 = lVar8 + -1;
    if (bVar11) break;
    if (J->base[uVar10] == 0) {
      sload(J,(int32_t)uVar10);
    }
  }
  uVar4 = pTVar2[func];
  local_90 = nargs;
  if ((uVar4 & 0x1f000000) != 0x8000000) {
    ix.tabv.u64 = *(uint64_t *)pTVar9;
    ix.tab = uVar4;
    iVar3 = lj_record_mm_lookup(J,&ix,MM_call);
    if ((iVar3 == 0) || ((ix.mobj & 0x1f000000) != 0x8000000)) {
      lj_trace_err(J,LJ_TRERR_NOMM);
    }
    local_90 = nargs + 1;
    for (lVar8 = local_90; 1 < lVar8; lVar8 = lVar8 + -1) {
      pTVar2[(ulong)func + lVar8 + 1] = pTVar2[(ulong)func + lVar8];
    }
    pTVar2[(ulong)func + 2] = pTVar2[func];
    pTVar2[func] = ix.mobj;
    pTVar9 = &ix.mobjv;
    uVar4 = ix.mobj;
  }
  o = (GCobj *)(pTVar9->u64 & 0x7fffffffffff);
  uVar1 = (o->gch).unused1;
  IVar7 = (IRRef1)uVar4;
  if ((uVar1 == 'X') || (uVar1 == '$')) {
    (J->fold).ins.field_0.op1 = IVar7;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45100003;
    TVar5 = lj_opt_fold(J);
    TVar6 = lj_ir_kint(J,(uint)(o->gch).unused1);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
    lj_opt_fold(J);
  }
  else if ((uVar1 == '\0') && (pTVar9 = (o->th).base, 0x5f < *(byte *)((long)pTVar9 + -0x2b))) {
    (J->fold).ins.field_0.op1 = IVar7;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090002;
    TVar5 = lj_opt_fold(J);
    TVar6 = lj_ir_kptr_(J,IR_KPTR,pTVar9);
    (J->fold).ins.field_0.ot = 0x889;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
    lj_opt_fold(J);
    lj_ir_kgc(J,(GCobj *)(pTVar9 + -0xd),IRT_PROTO);
  }
  else {
    uVar4 = lj_ir_kgc(J,o,IRT_FUNC);
    (J->fold).ins.field_0.ot = 0x888;
    (J->fold).ins.field_0.op1 = IVar7;
    (J->fold).ins.field_0.op2 = (IRRef1)uVar4;
    lj_opt_fold(J);
  }
  pTVar2[func] = uVar4;
  pTVar2[(ulong)func + 1] = 0x10000;
  J->maxslot = (BCReg)local_90;
  return;
}

Assistant:

static void rec_call_setup(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  RecordIndex ix;
  TValue *functv = &J->L->base[func];
  TRef kfunc, *fbase = &J->base[func];
  ptrdiff_t i;
  (void)getslot(J, func); /* Ensure func has a reference. */
  for (i = 1; i <= nargs; i++)
    (void)getslot(J, func+LJ_FR2+i);  /* Ensure all args have a reference. */
  if (!tref_isfunc(fbase[0])) {  /* Resolve __call metamethod. */
    ix.tab = fbase[0];
    copyTV(J->L, &ix.tabv, functv);
    if (!lj_record_mm_lookup(J, &ix, MM_call) || !tref_isfunc(ix.mobj))
      lj_trace_err(J, LJ_TRERR_NOMM);
    for (i = ++nargs; i > LJ_FR2; i--)  /* Shift arguments up. */
      fbase[i+LJ_FR2] = fbase[i+LJ_FR2-1];
#if LJ_FR2
    fbase[2] = fbase[0];
#endif
    fbase[0] = ix.mobj;  /* Replace function. */
    functv = &ix.mobjv;
  }
  kfunc = rec_call_specialize(J, funcV(functv), fbase[0]);
#if LJ_FR2
  fbase[0] = kfunc;
  fbase[1] = TREF_FRAME;
#else
  fbase[0] = kfunc | TREF_FRAME;
#endif
  J->maxslot = (BCReg)nargs;
}